

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nested_loop_join_inner.cpp
# Opt level: O2

idx_t duckdb::NestedLoopJoinInner::Perform
                (idx_t *lpos,idx_t *rpos,DataChunk *left_conditions,DataChunk *right_conditions,
                SelectionVector *lvector,SelectionVector *rvector,
                vector<duckdb::JoinCondition,_true> *conditions)

{
  idx_t right_size;
  reference pvVar1;
  reference pvVar2;
  const_reference pvVar3;
  idx_t iVar4;
  ulong uVar5;
  idx_t iVar6;
  ulong __n;
  
  if ((*lpos < left_conditions->count) && (*rpos < right_conditions->count)) {
    pvVar1 = vector<duckdb::Vector,_true>::get<true>(&left_conditions->data,0);
    pvVar2 = vector<duckdb::Vector,_true>::get<true>(&right_conditions->data,0);
    iVar6 = left_conditions->count;
    iVar4 = right_conditions->count;
    pvVar3 = vector<duckdb::JoinCondition,_true>::get<true>(conditions,0);
    iVar4 = NestedLoopJoinComparisonSwitch<duckdb::InitialNestedLoopJoin>
                      (pvVar1,pvVar2,iVar6,iVar4,lpos,rpos,lvector,rvector,0,pvVar3->comparison);
    __n = 1;
    while( true ) {
      uVar5 = ((long)(conditions->
                     super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>).
                     super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)(conditions->
                    super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>).
                    super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x18;
      if ((iVar4 == 0) || (uVar5 <= __n)) break;
      pvVar1 = vector<duckdb::Vector,_true>::get<true>(&left_conditions->data,__n);
      pvVar2 = vector<duckdb::Vector,_true>::get<true>(&right_conditions->data,__n);
      iVar6 = left_conditions->count;
      right_size = right_conditions->count;
      pvVar3 = vector<duckdb::JoinCondition,_true>::get<true>(conditions,__n);
      iVar4 = NestedLoopJoinComparisonSwitch<duckdb::RefineNestedLoopJoin>
                        (pvVar1,pvVar2,iVar6,right_size,lpos,rpos,lvector,rvector,iVar4,
                         pvVar3->comparison);
      __n = __n + 1;
    }
    iVar6 = 0;
    if (uVar5 <= __n) {
      iVar6 = iVar4;
    }
  }
  else {
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

idx_t NestedLoopJoinInner::Perform(idx_t &lpos, idx_t &rpos, DataChunk &left_conditions, DataChunk &right_conditions,
                                   SelectionVector &lvector, SelectionVector &rvector,
                                   const vector<JoinCondition> &conditions) {
	D_ASSERT(left_conditions.ColumnCount() == right_conditions.ColumnCount());
	if (lpos >= left_conditions.size() || rpos >= right_conditions.size()) {
		return 0;
	}
	// for the first condition, lvector and rvector are not set yet
	// we initialize them using the InitialNestedLoopJoin
	idx_t match_count = NestedLoopJoinComparisonSwitch<InitialNestedLoopJoin>(
	    left_conditions.data[0], right_conditions.data[0], left_conditions.size(), right_conditions.size(), lpos, rpos,
	    lvector, rvector, 0, conditions[0].comparison);
	// now resolve the rest of the conditions
	for (idx_t i = 1; i < conditions.size(); i++) {
		// check if we have run out of tuples to compare
		if (match_count == 0) {
			return 0;
		}
		// if not, get the vectors to compare
		Vector &l = left_conditions.data[i];
		Vector &r = right_conditions.data[i];
		// then we refine the currently obtained results using the RefineNestedLoopJoin
		match_count = NestedLoopJoinComparisonSwitch<RefineNestedLoopJoin>(
		    l, r, left_conditions.size(), right_conditions.size(), lpos, rpos, lvector, rvector, match_count,
		    conditions[i].comparison);
	}
	return match_count;
}